

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_57d50e7::DescriptorImpl::DescriptorImpl
          (DescriptorImpl *this,
          vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
          *pubkeys,unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                   *script,string *name)

{
  long lVar1;
  pointer pcVar2;
  pointer puVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_Descriptor)._vptr_Descriptor = (_func_int **)&PTR__DescriptorImpl_013bbff0;
  puVar3 = (pubkeys->
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->m_pubkey_args).
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pubkeys->
       super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->m_pubkey_args).
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = puVar3;
  (this->m_pubkey_args).
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pubkeys->
       super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (pubkeys->
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pubkeys->
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pubkeys->
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  pcVar2 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_name,pcVar2,pcVar2 + name->_M_string_length);
  (this->m_subdescriptor_args).
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_subdescriptor_args).
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_subdescriptor_args).
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
  ::reserve(&this->m_subdescriptor_args,1);
  std::
  vector<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,std::default_delete<(anonymous_namespace)::DescriptorImpl>>,std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,std::default_delete<(anonymous_namespace)::DescriptorImpl>>>>
  ::
  emplace_back<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,std::default_delete<(anonymous_namespace)::DescriptorImpl>>>
            ((vector<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,std::default_delete<(anonymous_namespace)::DescriptorImpl>>,std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,std::default_delete<(anonymous_namespace)::DescriptorImpl>>>>
              *)&this->m_subdescriptor_args,script);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

DescriptorImpl(std::vector<std::unique_ptr<PubkeyProvider>> pubkeys, std::unique_ptr<DescriptorImpl> script, const std::string& name) : m_pubkey_args(std::move(pubkeys)), m_name(name), m_subdescriptor_args(Vector(std::move(script))) {}